

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *
testing::internal::ActionResultHolder<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>
::
PerformAction<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>(std::__cxx11::string_const&,int,int,int,int,unsigned_int)>
          (Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
           *action,ArgumentTuple *args)

{
  ArgumentTuple *this;
  ActionResultHolder<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *this_00;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
  local_88;
  Result local_68;
  ReferenceOrValueWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>
  local_40;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
  *local_18;
  ArgumentTuple *args_local;
  Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this_00 = (ActionResultHolder<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *
            )operator_new(0x30);
  this = args_local;
  std::
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int>
  ::tuple(&local_88,local_18);
  Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::Perform(&local_68,
            (Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
             *)this,&local_88);
  ReferenceOrValueWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>::
  ReferenceOrValueWrapper(&local_40,&local_68);
  ActionResultHolder<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>::
  ActionResultHolder(this_00,&local_40);
  ReferenceOrValueWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_>::
  ~ReferenceOrValueWrapper(&local_40);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr(&local_68);
  return this_00;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }